

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QListViewItem * __thiscall
QListModeViewBase::indexToListViewItem(QListModeViewBase *this,QModelIndex *index)

{
  QRect r;
  bool bVar1;
  int iVar2;
  Flow FVar3;
  Int IVar4;
  qsizetype qVar5;
  const_reference piVar6;
  QModelIndex *in_RDX;
  QCommonListViewBase *in_RSI;
  QListViewItem *in_RDI;
  long in_FS_OFFSET;
  int right;
  int segment;
  QPoint pos;
  QSize cellSize;
  QSize size;
  QStyleOptionViewItem options;
  undefined4 in_stack_fffffffffffffe58;
  AlignmentFlag in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  QRect *in_stack_fffffffffffffe80;
  QCommonListViewBase *in_stack_fffffffffffffe88;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_118;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_114;
  int local_110;
  int local_10c;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_108;
  int local_104;
  int local_100;
  undefined1 *local_fc;
  QSize local_f4;
  QSize local_ec;
  QSize local_e4;
  int local_dc;
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<int>::isEmpty((QList<int> *)0x8837f3);
  if ((!bVar1) && (bVar1 = QList<int>::isEmpty((QList<int> *)0x883805), !bVar1)) {
    iVar2 = QModelIndex::row(in_RDX);
    qVar5 = QList<int>::size((QList<int> *)(in_RSI + 1));
    if ((long)iVar2 < qVar5 + -1) {
      local_dc = QModelIndex::row(in_RDX);
      QList<int>::size((QList<int> *)&in_RSI[2].dd);
      iVar2 = qBinarySearch<int>((QList<int> *)
                                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                 (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ),in_stack_fffffffffffffe64,
                                 in_stack_fffffffffffffe60);
      memset(local_d8,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x8838b7);
      QCommonListViewBase::initViewItemOption
                ((QCommonListViewBase *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (QStyleOptionViewItem *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QRect::setSize((QRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     (QSize *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      local_e4 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      bVar1 = QCommonListViewBase::uniformItemSizes(in_RSI);
      if (bVar1) {
        local_ec = QCommonListViewBase::cachedItemSize
                             ((QCommonListViewBase *)
                              CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        bVar1 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ));
        if (!bVar1) goto LAB_0088393b;
        local_e4 = QCommonListViewBase::cachedItemSize
                             ((QCommonListViewBase *)
                              CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      }
      else {
LAB_0088393b:
        local_e4 = QCommonListViewBase::itemSize
                             ((QCommonListViewBase *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                              (QStyleOptionViewItem *)
                              CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                              (QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      local_f4 = local_e4;
      local_fc = &DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      FVar3 = QCommonListViewBase::flow(in_RSI);
      if (FVar3 == LeftToRight) {
        QModelIndex::row(in_RDX);
        QList<int>::at((QList<int> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe5c);
        QList<int>::at((QList<int> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe5c);
      }
      else {
        in_stack_fffffffffffffe88 = in_RSI + 1;
        QModelIndex::row(in_RDX);
        QList<int>::at((QList<int> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe5c);
        QList<int>::at((QList<int> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe5c);
        bVar1 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x883a5f);
        if (bVar1) {
          in_stack_fffffffffffffe80 = (QRect *)(long)(iVar2 + 1);
          qVar5 = QList<int>::size((QList<int> *)&in_RSI[1].contentsSize);
          if ((long)in_stack_fffffffffffffe80 < qVar5) {
            piVar6 = QList<int>::at((QList<int> *)
                                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            in_stack_fffffffffffffe78 = *piVar6;
          }
          else {
            in_stack_fffffffffffffe78 = QSize::width((QSize *)0x883a9f);
          }
          in_stack_fffffffffffffe7c = in_stack_fffffffffffffe78;
          QPoint::x((QPoint *)0x883ae0);
          QSize::setWidth((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe5c);
        }
        else {
          local_100 = QSize::width((QSize *)0x883b02);
          QCommonListViewBase::viewport(in_RSI);
          in_stack_fffffffffffffe74 = QWidget::width((QWidget *)0x883b1b);
          iVar2 = QCommonListViewBase::spacing((QCommonListViewBase *)0x883b29);
          local_104 = in_stack_fffffffffffffe74 + iVar2 * -2;
          qMax<int>(&local_100,&local_104);
          QSize::setWidth((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe5c);
        }
      }
      local_108.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      in_stack_fffffffffffffe5c);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_108);
      if (IVar4 == 0) {
        QSize::width((QSize *)0x883cf4);
        QSize::setWidth((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
      }
      else {
        local_10c = QSize::width((QSize *)0x883ba4);
        local_110 = QSize::width((QSize *)0x883bb8);
        qMin<int>(&local_10c,&local_110);
        QSize::setWidth((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
        local_114.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&
                       ((QFlags<Qt::AlignmentFlag> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_114);
        if (IVar4 != 0) {
          in_stack_fffffffffffffe6c = QPoint::x((QPoint *)0x883c23);
          in_stack_fffffffffffffe70 = QSize::width((QSize *)0x883c34);
          in_stack_fffffffffffffe70 = in_stack_fffffffffffffe6c + in_stack_fffffffffffffe70;
          QSize::width((QSize *)0x883c4d);
          QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe5c);
        }
        local_118.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&
                       ((QFlags<Qt::AlignmentFlag> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_118);
        if (IVar4 != 0) {
          in_stack_fffffffffffffe64 = QPoint::x((QPoint *)0x883ca0);
          in_stack_fffffffffffffe68 = QSize::width((QSize *)0x883cb1);
          QSize::width((QSize *)0x883cc2);
          QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe5c);
        }
      }
      QRect::QRect(in_stack_fffffffffffffe80,
                   (QPoint *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (QSize *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      QModelIndex::row(in_RDX);
      r._8_8_ = in_stack_fffffffffffffe88;
      r._0_8_ = in_stack_fffffffffffffe80;
      QListViewItem::QListViewItem
                ((QListViewItem *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),r,
                 in_stack_fffffffffffffe64);
      QStyleOptionViewItem::~QStyleOptionViewItem
                ((QStyleOptionViewItem *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      goto LAB_00883d53;
    }
  }
  QListViewItem::QListViewItem(in_RDI);
LAB_00883d53:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QListViewItem QListModeViewBase::indexToListViewItem(const QModelIndex &index) const
{
    if (flowPositions.isEmpty()
        || segmentPositions.isEmpty()
        || index.row() >= flowPositions.size() - 1)
        return QListViewItem();

    const int segment = qBinarySearch<int>(segmentStartRows, index.row(),
                                           0, segmentStartRows.size() - 1);


    QStyleOptionViewItem options;
    initViewItemOption(&options);
    options.rect.setSize(contentsSize);
    QSize size = (uniformItemSizes() && cachedItemSize().isValid())
                 ? cachedItemSize() : itemSize(options, index);
    QSize cellSize = size;

    QPoint pos;
    if (flow() == QListView::LeftToRight) {
        pos.setX(flowPositions.at(index.row()));
        pos.setY(segmentPositions.at(segment));
    } else { // TopToBottom
        pos.setY(flowPositions.at(index.row()));
        pos.setX(segmentPositions.at(segment));
        if (isWrapping()) { // make the items as wide as the segment
            int right = (segment + 1 >= segmentPositions.size()
                     ? contentsSize.width()
                     : segmentPositions.at(segment + 1));
            cellSize.setWidth(right - pos.x());
        } else { // make the items as wide as the viewport
            cellSize.setWidth(qMax(size.width(), viewport()->width() - 2 * spacing()));
        }
    }

    if (dd->itemAlignment & Qt::AlignHorizontal_Mask) {
        size.setWidth(qMin(size.width(), cellSize.width()));
        if (dd->itemAlignment & Qt::AlignRight)
            pos.setX(pos.x() + cellSize.width() - size.width());
        if (dd->itemAlignment & Qt::AlignHCenter)
            pos.setX(pos.x() + (cellSize.width() - size.width()) / 2);
    } else {
        size.setWidth(cellSize.width());
    }

    return QListViewItem(QRect(pos, size), index.row());
}